

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# limbo.cpp
# Opt level: O0

vector<unsigned_char,_std::allocator<unsigned_char>_> *
anon_unknown.dwarf_3699c::commit_to_party_seed
          (limbo_instance_t *instance,vector<unsigned_char,_std::allocator<unsigned_char>_> *seed,
          limbo_salt_t *salt,size_t rep_idx,size_t party_idx)

{
  allocator_type *__a;
  uchar *__n;
  hash_context *ctx_00;
  array<unsigned_char,_32UL> *in_RCX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDX;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RDI;
  hash_context ctx;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *commitment;
  undefined6 in_stack_fffffffffffffe60;
  uint16_t in_stack_fffffffffffffe66;
  hash_context *in_stack_fffffffffffffe68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_140 [10];
  array<unsigned_char,_32UL> *local_50;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_48;
  
  this = local_140;
  local_50 = in_RCX;
  local_48 = in_RDX;
  hash_init(in_stack_fffffffffffffe68,CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60))
  ;
  __a = (allocator_type *)
        std::array<unsigned_char,_32UL>::data((array<unsigned_char,_32UL> *)0x116c95);
  std::array<unsigned_char,_32UL>::size(local_50);
  hash_update(in_stack_fffffffffffffe68,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60),0x116cb9);
  hash_update_uint16_le(in_stack_fffffffffffffe68,in_stack_fffffffffffffe66);
  hash_update_uint16_le(in_stack_fffffffffffffe68,in_stack_fffffffffffffe66);
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x116cea);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_48);
  hash_update(in_stack_fffffffffffffe68,
              (uint8_t *)CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60),0x116d0e);
  hash_final((hash_context *)0x116d18);
  std::allocator<unsigned_char>::allocator((allocator<unsigned_char> *)0x116d3c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(this,(size_type)__n,__a);
  std::allocator<unsigned_char>::~allocator((allocator<unsigned_char> *)0x116d5c);
  ctx_00 = (hash_context *)
           std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x116d66);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RDI);
  hash_squeeze(ctx_00,(uint8_t *)CONCAT26(in_stack_fffffffffffffe66,in_stack_fffffffffffffe60),
               0x116d87);
  return in_RDI;
}

Assistant:

std::vector<uint8_t> commit_to_party_seed(const limbo_instance_t &instance,
                                          const std::vector<uint8_t> &seed,
                                          const limbo_salt_t &salt,
                                          size_t rep_idx, size_t party_idx) {
  hash_context ctx;
  hash_init(&ctx, instance.digest_size);
  hash_update(&ctx, salt.data(), salt.size());
  hash_update_uint16_le(&ctx, (uint16_t)rep_idx);
  hash_update_uint16_le(&ctx, (uint16_t)party_idx);
  hash_update(&ctx, seed.data(), seed.size());
  hash_final(&ctx);

  std::vector<uint8_t> commitment(instance.digest_size);
  hash_squeeze(&ctx, commitment.data(), commitment.size());
  return commitment;
}